

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void gpu_mapping_destroy(gpu_mapping *gpu_mapping)

{
  gpu_mapping **ppgVar1;
  gpu_mapping *pgVar2;
  gpu_mapping *__ptr;
  
  __ptr = gpu_mapping->object->gpu_mappings;
  if (__ptr == (gpu_mapping *)0x0) {
LAB_00244e79:
    fprintf(_stdout,"ERROR: can\'t find gpu_mapping on object\'s gpu_mappings list%s\n","");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  }
  if (__ptr == gpu_mapping) {
    pgVar2 = (gpu_mapping *)0x0;
  }
  else {
    do {
      pgVar2 = __ptr;
      __ptr = pgVar2->next;
      if (__ptr == (gpu_mapping *)0x0) goto LAB_00244e79;
    } while (__ptr != gpu_mapping);
  }
  ppgVar1 = &pgVar2->next;
  if (pgVar2 == (gpu_mapping *)0x0) {
    ppgVar1 = &gpu_mapping->object->gpu_mappings;
  }
  *ppgVar1 = __ptr->next;
  __ptr->next = (gpu_mapping *)0x0;
  free(__ptr);
  return;
}

Assistant:

void gpu_mapping_destroy(struct gpu_mapping *gpu_mapping)
{
	struct gpu_object *obj = gpu_mapping->object;

	struct gpu_mapping *it, *prev = NULL;
	for (it = obj->gpu_mappings; it != NULL; prev = it, it = it->next)
		if (it == gpu_mapping)
		{
			if (prev)
				prev->next = it->next;
			else
				obj->gpu_mappings = it->next;
			it->next = NULL;
			free(it);

			return;
		}
	mmt_error("can't find gpu_mapping on object's gpu_mappings list%s\n", "");
	demmt_abort();
}